

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# node.cpp
# Opt level: O2

void __thiscall despot::QNode::~QNode(QNode *this)

{
  VNode *this_00;
  _Base_ptr p_Var1;
  _Self __tmp;
  
  p_Var1 = (this->children_)._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
  while( true ) {
    if ((_Rb_tree_header *)p_Var1 == &(this->children_)._M_t._M_impl.super__Rb_tree_header) {
      std::
      _Rb_tree<unsigned_long,_std::pair<const_unsigned_long,_despot::VNode_*>,_std::_Select1st<std::pair<const_unsigned_long,_despot::VNode_*>_>,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_despot::VNode_*>_>_>
      ::clear(&(this->children_)._M_t);
      std::
      _Rb_tree<unsigned_long,_std::pair<const_unsigned_long,_despot::VNode_*>,_std::_Select1st<std::pair<const_unsigned_long,_despot::VNode_*>_>,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_despot::VNode_*>_>_>
      ::~_Rb_tree(&(this->children_)._M_t);
      return;
    }
    this_00 = (VNode *)p_Var1[1]._M_parent;
    if (this_00 == (VNode *)0x0) break;
    VNode::~VNode(this_00);
    operator_delete(this_00,0x98);
    p_Var1 = (_Base_ptr)std::_Rb_tree_increment(p_Var1);
  }
  __assert_fail("it->second != NULL",
                "/workspace/llm4binary/github/license_c_cmakelists/AdaCompNUS[P]despot/src/core/node.cpp"
                ,0x120,"despot::QNode::~QNode()");
}

Assistant:

QNode::~QNode() {
	for (map<OBS_TYPE, VNode*>::iterator it = children_.begin();
		it != children_.end(); it++) {
		assert(it->second != NULL);
		delete it->second;
	}
	children_.clear();
}